

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,
          offset_datetime_type *odt,offset_datetime_format_info *fmt,source_location *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  datetime_delimiter_kind dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  ostringstream oss;
  string_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  long *local_1c0 [2];
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  toml::operator<<((ostream *)local_1a0,&odt->date);
  dVar2 = fmt->delimiter;
  if (dVar2 == upper_T) {
    local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_200._1_7_,0x54);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)&local_200,1);
  }
  else if (dVar2 == lower_t) {
    local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_200._1_7_,0x74);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)&local_200,1);
  }
  else if (dVar2 == space) {
    local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_200._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)&local_200,1);
  }
  else {
    local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_200._1_7_,0x54);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)&local_200,1);
  }
  format_local_time_abi_cxx11_(&local_220,this,&odt->time,fmt->has_seconds,fmt->subsecond_precision)
  ;
  local_1d8 = local_220._M_string_length;
  paVar1 = &local_220.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p == paVar1) {
    local_1f0._8_8_ = local_220.field_2._8_8_;
    local_200 = &local_1f0;
  }
  else {
    local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p;
  }
  local_1f0._M_allocated_capacity._1_7_ = local_220.field_2._M_allocated_capacity._1_7_;
  local_1f0._M_local_buf[0] = local_220.field_2._M_local_buf[0];
  local_1f8 = local_220._M_string_length;
  local_220._M_string_length = 0;
  local_220.field_2._M_local_buf[0] = '\0';
  if (local_200 == &local_1f0) {
    local_1d0._8_8_ = local_1f0._8_8_;
    local_1e0 = &local_1d0;
  }
  else {
    local_1e0 = local_200;
  }
  local_1d0._M_allocated_capacity = local_1f0._M_allocated_capacity;
  local_220._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,local_1e0->_M_local_buf,local_1d8);
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar1) {
    operator_delete(local_220._M_dataplus._M_p,
                    CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                             local_220.field_2._M_local_buf[0]) + 1);
  }
  toml::operator<<((ostream *)local_1a0,&odt->offset);
  std::__cxx11::stringbuf::str();
  string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
            (__return_storage_ptr__,(detail *)local_1c0,s);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const offset_datetime_type& odt, const offset_datetime_format_info& fmt, const source_location&) // {{{
    {
        std::ostringstream oss;
        oss << odt.date;
        switch(fmt.delimiter)
        {
            case datetime_delimiter_kind::upper_T: { oss << 'T'; break; }
            case datetime_delimiter_kind::lower_t: { oss << 't'; break; }
            case datetime_delimiter_kind::space:   { oss << ' '; break; }
            default:                               { oss << 'T'; break; }
        }
        oss << string_conv<std::string>(this->format_local_time(odt.time, fmt.has_seconds, fmt.subsecond_precision));
        oss << odt.offset;
        return string_conv<string_type>(oss.str());
    }